

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_request_auth_agent(LIBSSH2_CHANNEL *channel,char *request_str,int request_str_len)

{
  char cVar1;
  int iVar2;
  uchar code;
  size_t data_len;
  uchar *data;
  uchar *puStack_38;
  int rc;
  uchar *s;
  LIBSSH2_SESSION *session;
  char *pcStack_20;
  int request_str_len_local;
  char *request_str_local;
  LIBSSH2_CHANNEL *channel_local;
  
  s = (uchar *)channel->session;
  session._4_4_ = request_str_len;
  pcStack_20 = request_str;
  request_str_local = (char *)channel;
  if (channel->req_auth_agent_state == libssh2_NB_state_idle) {
    if (0x1a < request_str_len) {
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x22,"request_str length too large");
      return iVar2;
    }
    channel->req_auth_agent_packet_len = (long)(request_str_len + 10);
    memset(&channel->req_auth_agent_requirev_state,0,8);
    puStack_38 = (uchar *)(request_str_local + 0x2c5);
    request_str_local[0x2c4] = 'b';
    _libssh2_store_u32(&stack0xffffffffffffffc8,*(uint32_t *)(request_str_local + 0x4c));
    _libssh2_store_str(&stack0xffffffffffffffc8,pcStack_20,(long)session._4_4_);
    *puStack_38 = '\x01';
    request_str_local[0x2c0] = '\x02';
    request_str_local[0x2c1] = '\0';
    request_str_local[0x2c2] = '\0';
    request_str_local[0x2c3] = '\0';
    puStack_38 = puStack_38 + 1;
  }
  if (*(int *)(request_str_local + 0x2c0) == 2) {
    data._4_4_ = _libssh2_transport_send
                           ((LIBSSH2_SESSION *)s,(uchar *)(request_str_local + 0x2c4),
                            *(size_t *)(request_str_local + 0x2e8),(uchar *)0x0,0);
    if (data._4_4_ == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)s,-0x25,"Would block sending auth-agent request");
      return data._4_4_;
    }
    if (data._4_4_ != 0) {
      request_str_local[0x2c0] = '\0';
      request_str_local[0x2c1] = '\0';
      request_str_local[0x2c2] = '\0';
      request_str_local[0x2c3] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,data._4_4_,"Unable to send auth-agent request");
      return iVar2;
    }
    _libssh2_htonu32((uchar *)(request_str_local + 0x2f0),*(uint32_t *)(request_str_local + 0x38));
    request_str_local[0x2c0] = '\x03';
    request_str_local[0x2c1] = '\0';
    request_str_local[0x2c2] = '\0';
    request_str_local[0x2c3] = '\0';
  }
  if (*(int *)(request_str_local + 0x2c0) == 3) {
    data._4_4_ = _libssh2_packet_requirev
                           ((LIBSSH2_SESSION *)s,"cd",(uchar **)&data_len,
                            (size_t *)&stack0xffffffffffffffb0,1,
                            (uchar *)(request_str_local + 0x2f0),4,
                            (packet_requirev_state_t *)(request_str_local + 0x2f8));
    if (data._4_4_ == -0x25) {
      return -0x25;
    }
    if (data._4_4_ != 0) {
      request_str_local[0x2c0] = '\0';
      request_str_local[0x2c1] = '\0';
      request_str_local[0x2c2] = '\0';
      request_str_local[0x2c3] = '\0';
      iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0xe,"Failed to request auth-agent");
      return iVar2;
    }
    cVar1 = *(char *)data_len;
    (**(code **)(s + 0x18))(data_len,s);
    request_str_local[0x2c0] = '\0';
    request_str_local[0x2c1] = '\0';
    request_str_local[0x2c2] = '\0';
    request_str_local[0x2c3] = '\0';
    if (cVar1 == 'c') {
      return 0;
    }
  }
  iVar2 = _libssh2_error((LIBSSH2_SESSION *)s,-0x16,"Unable to complete request for auth-agent");
  return iVar2;
}

Assistant:

static int channel_request_auth_agent(LIBSSH2_CHANNEL *channel,
                                      const char *request_str,
                                      int request_str_len)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    int rc;

    if(channel->req_auth_agent_state == libssh2_NB_state_idle) {
        /* Only valid options are "auth-agent-req" and
         * "auth-agent-req_at_openssh.com" so we make sure it is not
         * actually longer than the longest possible. */
        if(request_str_len > 26) {
            return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                                  "request_str length too large");
        }

        /*
         *  Length: 24 or 36 = packet_type(1) + channel(4) + req_len(4) +
         *    request_str (variable) + want_reply (1) */
        channel->req_auth_agent_packet_len = 10 + request_str_len;

        /* Zero out the requireev state to reset */
        memset(&channel->req_auth_agent_requirev_state, 0,
               sizeof(channel->req_auth_agent_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Requesting auth agent on channel %u/%u",
                       channel->local.id, channel->remote.id));

        /*
         *  byte      SSH_MSG_CHANNEL_REQUEST
         *  uint32    recipient channel
         *  string    "auth-agent-req"
         *  boolean   want reply
         * */
        s = channel->req_auth_agent_packet;
        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, (const char *)request_str, request_str_len);
        *(s++) = 0x01;

        channel->req_auth_agent_state = libssh2_NB_state_created;
    }

    if(channel->req_auth_agent_state == libssh2_NB_state_created) {
        /* Send the packet, we can use sizeof() on the packet because it
         * is always completely filled; there are no variable length fields. */
        rc = _libssh2_transport_send(session, channel->req_auth_agent_packet,
                                     channel->req_auth_agent_packet_len,
                                     NULL, 0);

        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending auth-agent request");
            return rc;
        }
        else if(rc) {
            channel->req_auth_agent_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Unable to send auth-agent request");
        }
        _libssh2_htonu32(channel->req_auth_agent_local_channel,
                         channel->local.id);
        channel->req_auth_agent_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_state == libssh2_NB_state_sent) {
        unsigned char *data;
        size_t data_len;
        unsigned char code;

        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      1, channel->req_auth_agent_local_channel,
                                      4,
                                      &channel->req_auth_agent_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            channel->req_auth_agent_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Failed to request auth-agent");
        }

        code = data[0];

        LIBSSH2_FREE(session, data);
        channel->req_auth_agent_state = libssh2_NB_state_idle;

        if(code == SSH_MSG_CHANNEL_SUCCESS)
            return 0;
    }

    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete request for auth-agent");
}